

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void libcellml::updateUnitsMapWithStandardUnit(string *name,UnitsMap *unitsMap,double exp)

{
  _Rb_tree_node_base *__k;
  double dVar1;
  mapped_type *pmVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  double local_38;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                 *)standardUnitsList_abi_cxx11_,name);
  p_Var5 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    do {
      __k = p_Var5 + 1;
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              ::find(&unitsMap->_M_t,(key_type *)__k);
      if ((_Rb_tree_header *)iVar3._M_node == &(unitsMap->_M_t)._M_impl.super__Rb_tree_header) {
        local_38 = 0.0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,double>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                    *)unitsMap,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                   &local_38);
      }
      dVar1 = *(double *)(p_Var5 + 2);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](unitsMap,(key_type *)__k);
      *pmVar4 = dVar1 * exp + *pmVar4;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  return;
}

Assistant:

void updateUnitsMapWithStandardUnit(const std::string &name, UnitsMap &unitsMap, double exp)
{
    for (const auto &baseUnitsComponent : standardUnitsList.at(name)) {
        auto unitsMapIter = unitsMap.find(baseUnitsComponent.first);
        if (unitsMapIter == unitsMap.end()) {
            unitsMap.emplace(baseUnitsComponent.first, 0.0);
        }
        unitsMap[baseUnitsComponent.first] += baseUnitsComponent.second * exp;
    }
}